

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O1

void __thiscall TorController::~TorController(TorController *this)

{
  CService *addr;
  long lVar1;
  pointer puVar2;
  pointer pcVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->reconnect_ev != (event *)0x0) {
    event_free();
    this->reconnect_ev = (event *)0x0;
  }
  addr = &this->service;
  bVar4 = CNetAddr::IsValid(&addr->super_CNetAddr);
  if (bVar4) {
    RemoveLocal(addr);
  }
  puVar2 = (this->clientNonce).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->clientNonce).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  puVar2 = (this->cookie).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->cookie).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  if (0x10 < (this->m_target).super_CNetAddr.m_addr._size) {
    free((this->m_target).super_CNetAddr.m_addr._union.indirect_contents.indirect);
    (this->m_target).super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < (this->service).super_CNetAddr.m_addr._size) {
    free((addr->super_CNetAddr).m_addr._union.indirect_contents.indirect);
    (addr->super_CNetAddr).m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  pcVar3 = (this->service_id)._M_dataplus._M_p;
  paVar5 = &(this->service_id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->private_key)._M_dataplus._M_p;
  paVar5 = &(this->private_key).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
  }
  TorControlConnection::~TorControlConnection(&this->conn);
  pcVar3 = (this->m_tor_control_center)._M_dataplus._M_p;
  paVar5 = &(this->m_tor_control_center).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar5) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TorController::~TorController()
{
    if (reconnect_ev) {
        event_free(reconnect_ev);
        reconnect_ev = nullptr;
    }
    if (service.IsValid()) {
        RemoveLocal(service);
    }
}